

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlGetUTF8Char(uchar *utf,int *len)

{
  uint uVar1;
  uint c;
  int *len_local;
  uchar *utf_local;
  
  if ((utf != (uchar *)0x0) && (len != (int *)0x0)) {
    uVar1 = (uint)*utf;
    if (uVar1 < 0x80) {
      if (0 < *len) {
        *len = 1;
        return uVar1;
      }
    }
    else if ((1 < *len) && ((utf[1] & 0xc0) == 0x80)) {
      if (uVar1 < 0xe0) {
        if (0xc1 < uVar1) {
          *len = 2;
          return utf[1] & 0x3f | (uVar1 & 0x1f) << 6;
        }
      }
      else if ((2 < *len) && ((utf[2] & 0xc0) == 0x80)) {
        if (uVar1 < 0xf0) {
          *len = 3;
          uVar1 = utf[2] & 0x3f | (utf[1] & 0x3f) << 6 | (uVar1 & 0xf) << 0xc;
          if ((0x7ff < uVar1) && ((uVar1 < 0xd800 || (0xdfff < uVar1)))) {
            return uVar1;
          }
        }
        else if ((3 < *len) && ((utf[3] & 0xc0) == 0x80)) {
          *len = 4;
          uVar1 = utf[3] & 0x3f |
                  (utf[2] & 0x3f) << 6 | (utf[1] & 0x3f) << 0xc | (uVar1 & 7) << 0x12;
          if ((0xffff < uVar1) && (uVar1 < 0x110000)) {
            return uVar1;
          }
        }
      }
    }
  }
  if (len != (int *)0x0) {
    *len = 0;
  }
  return -1;
}

Assistant:

int
xmlGetUTF8Char(const unsigned char *utf, int *len) {
    unsigned int c;

    if (utf == NULL)
        goto error;
    if (len == NULL)
        goto error;

    c = utf[0];
    if (c < 0x80) {
        if (*len < 1)
            goto error;
        /* 1-byte code */
        *len = 1;
    } else {
        if ((*len < 2) || ((utf[1] & 0xc0) != 0x80))
            goto error;
        if (c < 0xe0) {
            if (c < 0xc2)
                goto error;
            /* 2-byte code */
            *len = 2;
            c = (c & 0x1f) << 6;
            c |= utf[1] & 0x3f;
        } else {
            if ((*len < 3) || ((utf[2] & 0xc0) != 0x80))
                goto error;
            if (c < 0xf0) {
                /* 3-byte code */
                *len = 3;
                c = (c & 0xf) << 12;
                c |= (utf[1] & 0x3f) << 6;
                c |= utf[2] & 0x3f;
                if ((c < 0x800) || ((c >= 0xd800) && (c < 0xe000)))
                    goto error;
            } else {
                if ((*len < 4) || ((utf[3] & 0xc0) != 0x80))
                    goto error;
                *len = 4;
                /* 4-byte code */
                c = (c & 0x7) << 18;
                c |= (utf[1] & 0x3f) << 12;
                c |= (utf[2] & 0x3f) << 6;
                c |= utf[3] & 0x3f;
                if ((c < 0x10000) || (c >= 0x110000))
                    goto error;
            }
        }
    }
    return(c);

error:
    if (len != NULL)
	*len = 0;
    return(-1);
}